

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::api::anon_unknown_0::BuffersTestCase::createInstance(BuffersTestCase *this,Context *ctx)

{
  VkSharingMode VVar1;
  MessageBuilder *this_00;
  BufferTestInstance *this_01;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  long lVar2;
  SparseContext *pSVar3;
  NotSupportedError *this_02;
  ulong uVar4;
  size_t queueNdx;
  long lVar5;
  RefBase<vk::VkDevice_s_*> local_248;
  float queuePriority;
  undefined1 local_228 [24];
  VkDeviceQueueCreateInfo *pVStack_210;
  undefined8 local_208;
  char **ppcStack_200;
  undefined8 local_1f8;
  char **ppcStack_1f0;
  VkPhysicalDeviceFeatures *local_1e8;
  VkDeviceQueueCreateInfo local_1d8;
  VkPhysicalDeviceFeatures deviceFeatures;
  
  deviceFeatures._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&deviceFeatures.imageCubeArray);
  ::vk::getBufferUsageFlagsStr((Bitfield<32UL> *)local_228,(this->m_testCase).usage);
  this_00 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&deviceFeatures,(Bitfield<32UL> *)local_228);
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&deviceFeatures.imageCubeArray);
  this_01 = (BufferTestInstance *)operator_new(0x30);
  uVar4._0_4_ = (this->m_testCase).usage;
  uVar4._4_4_ = (this->m_testCase).flags;
  VVar1 = (this->m_testCase).sharingMode;
  (this_01->super_TestInstance).m_context = ctx;
  (this_01->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BufferTestInstance_00bca850
  ;
  (this_01->m_testCase).usage = (undefined4)uVar4;
  (this_01->m_testCase).flags = uVar4._4_4_;
  (this_01->m_testCase).sharingMode = VVar1;
  if ((uVar4 & 0x700000000) == 0) {
    pSVar3 = (SparseContext *)0x0;
  }
  else {
    vk = BufferTestInstance::getInstanceInterface(this_01);
    physicalDevice = BufferTestInstance::getPhysicalDevice(this_01);
    ::vk::getPhysicalDeviceFeatures(&deviceFeatures,vk,physicalDevice);
    ::vk::getPhysicalDeviceQueueFamilyProperties
              ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
               local_228,vk,physicalDevice);
    lVar2 = local_228._8_8_ - local_228._0_8_;
    uVar4 = lVar2 % 0x18;
    lVar5 = 0;
    while( true ) {
      if (lVar2 / 0x18 == lVar5) {
        this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38,0x18,uVar4);
        tcu::NotSupportedError::NotSupportedError
                  (this_02,"No matching queue found",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                   ,0x82);
        __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      uVar4 = (ulong)~((pointer)local_228._0_8_)->queueFlags;
      if ((~((pointer)local_228._0_8_)->queueFlags & 9) == 0) break;
      lVar5 = lVar5 + 1;
      local_228._0_8_ = local_228._0_8_ + 0x18;
    }
    std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
    ~_Vector_base((_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   *)local_228);
    local_1d8.pQueuePriorities = &queuePriority;
    queuePriority = 1.0;
    pVStack_210 = &local_1d8;
    local_1d8.pNext = (void *)0x0;
    local_228._8_8_ = (pointer)0x0;
    local_208._0_4_ = 0;
    local_208._4_4_ = 0;
    ppcStack_200 = (char **)0x0;
    local_1f8._0_4_ = 0;
    local_1f8._4_4_ = 0;
    ppcStack_1f0 = (char **)0x0;
    local_1d8.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
    local_1d8._4_4_ = 0;
    local_1d8._16_8_ = lVar5 << 0x20;
    local_1d8.queueCount = 1;
    local_1d8._28_4_ = 0;
    local_228._0_8_ = (pointer)0x3;
    local_228._16_8_ = &DAT_100000000;
    local_1e8 = &deviceFeatures;
    ::vk::createDevice((Move<vk::VkDevice_s_*> *)&local_248,vk,physicalDevice,
                       (VkDeviceCreateInfo *)local_228,(VkAllocationCallbacks *)0x0);
    pSVar3 = (SparseContext *)operator_new(0x4d8);
    *(VkAllocationCallbacks **)
     ((long)&(pSVar3->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter + 8) =
         local_248.m_data.deleter.m_allocator;
    (pSVar3->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object = local_248.m_data.object;
    (pSVar3->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
         local_248.m_data.deleter.m_destroyDevice;
    local_248.m_data.object = (VkDevice_s *)0x0;
    local_248.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
    local_248.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    pSVar3->m_queueFamilyIndex = (deUint32)lVar5;
    ::vk::DeviceDriver::DeviceDriver
              (&pSVar3->m_deviceInterface,vk,
               (pSVar3->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object);
    ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_248);
  }
  (this_01->m_sparseContext).
  super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
  .m_data.ptr = pSVar3;
  return &this_01->super_TestInstance;
}

Assistant:

virtual TestInstance*	createInstance		(Context&				ctx) const
							{
								tcu::TestLog& log	= m_testCtx.getLog();
								log << tcu::TestLog::Message << getBufferUsageFlagsStr(m_testCase.usage) << tcu::TestLog::EndMessage;
								return new BufferTestInstance(ctx, m_testCase);
							}